

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

QList<QTextCharFormat> * __thiscall
QList<QTextCharFormat>::fill(QList<QTextCharFormat> *this,parameter_type t,qsizetype newSize)

{
  Data *pDVar1;
  qsizetype qVar2;
  QArrayData *pQVar3;
  QTextCharFormat *pQVar4;
  QTextFormat *pQVar5;
  long lVar6;
  long lVar7;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayData *local_50;
  QArrayDataPointer<QTextCharFormat> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (newSize == -1) {
    newSize = (this->d).size;
  }
  pDVar1 = (this->d).d;
  lVar6 = newSize;
  if (pDVar1 != (Data *)0x0) {
    lVar6 = (pDVar1->super_QArrayData).alloc;
    if (newSize <= lVar6 &&
        (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2) {
      local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_48.ptr = (QTextCharFormat *)&DAT_aaaaaaaaaaaaaaaa;
      QTextFormat::QTextFormat((QTextFormat *)&local_48,&t->super_QTextFormat);
      lVar6 = (this->d).size;
      lVar7 = newSize;
      if (lVar6 < newSize) {
        lVar7 = lVar6;
      }
      if (lVar7 != 0) {
        lVar7 = lVar7 << 4;
        pQVar5 = &((this->d).ptr)->super_QTextFormat;
        do {
          QTextFormat::operator=(pQVar5,&t->super_QTextFormat);
          lVar7 = lVar7 + -0x10;
          pQVar5 = pQVar5 + 1;
        } while (lVar7 != 0);
        lVar6 = (this->d).size;
      }
      if (newSize - lVar6 == 0 || newSize < lVar6) {
        if (newSize < lVar6) {
          pQVar5 = &(this->d).ptr[newSize].super_QTextFormat;
          lVar6 = lVar6 * 0x10 + newSize * -0x10;
          do {
            QTextFormat::~QTextFormat(pQVar5);
            pQVar5 = pQVar5 + 1;
            lVar6 = lVar6 + -0x10;
          } while (lVar6 != 0);
          (this->d).size = newSize;
        }
      }
      else {
        QtPrivate::QGenericArrayOps<QTextCharFormat>::copyAppend
                  ((QGenericArrayOps<QTextCharFormat> *)this,newSize - lVar6,
                   (parameter_type)&local_48);
      }
      QTextFormat::~QTextFormat((QTextFormat *)&local_48);
      goto LAB_004b8ffe;
    }
    if (lVar6 <= newSize) {
      lVar6 = newSize;
    }
    if (((pDVar1->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
         super_QFlagsStorage<QArrayData::ArrayOption>.i & 1) == 0) {
      lVar6 = newSize;
    }
  }
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (QTextCharFormat *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_50 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar4 = (QTextCharFormat *)QArrayData::allocate(&local_50,0x10,0x10,lVar6,KeepSize);
  pQVar3 = local_50;
  local_48.size = 0;
  local_48.ptr = pQVar4;
  for (; newSize != 0; newSize = newSize + -1) {
    QTextFormat::QTextFormat(&pQVar4[local_48.size].super_QTextFormat,&t->super_QTextFormat);
    local_48.size = local_48.size + 1;
  }
  local_48.d = (this->d).d;
  (this->d).d = (Data *)pQVar3;
  pQVar4 = (this->d).ptr;
  (this->d).ptr = local_48.ptr;
  qVar2 = (this->d).size;
  (this->d).size = local_48.size;
  local_48.ptr = pQVar4;
  local_48.size = qVar2;
  QArrayDataPointer<QTextCharFormat>::~QArrayDataPointer(&local_48);
LAB_004b8ffe:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

inline QList<T> &QList<T>::fill(parameter_type t, qsizetype newSize)
{
    if (newSize == -1)
        newSize = size();
    if (d->needsDetach() || newSize > capacity()) {
        // must allocate memory
        DataPointer detached(d->detachCapacity(newSize));
        detached->copyAppend(newSize, t);
        d.swap(detached);
    } else {
        // we're detached
        const T copy(t);
        d->assign(d.begin(), d.begin() + qMin(size(), newSize), t);
        if (newSize > size()) {
            d->copyAppend(newSize - size(), copy);
        } else if (newSize < size()) {
            d->truncate(newSize);
        }
    }
    return *this;
}